

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O0

mcsseg mcsout(mcscxdef *ctx,uint objid,uchar *ptr,ushort siz,mcsseg oldseg,int dirty)

{
  bool bVar1;
  uchar *puVar2;
  mcscxdef *pmVar3;
  ushort in_CX;
  int in_ESI;
  long in_RDI;
  ushort in_R8W;
  int in_R9D;
  ushort minsiz;
  mcsseg cur;
  mcsseg min;
  uint j;
  uint i;
  mcsdsdef **pagep;
  mcsdsdef *desc;
  mcscxdef *in_stack_000001f0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  ushort in_stack_ffffffffffffffba;
  ushort uVar5;
  uint in_stack_ffffffffffffffc0;
  uint uVar6;
  mcsdsdef *desc_00;
  errcxdef *in_stack_ffffffffffffffd0;
  mcsseg local_2;
  
  if ((((in_R8W == 0xffff) ||
       (in_stack_ffffffffffffffd0 =
             (errcxdef *)
             (*(long *)(*(long *)(in_RDI + 0x28) + (long)((int)(uint)in_R8W >> 8) * 8) +
             (long)(int)(in_R8W & 0xff) * 0x18),
       ((ulong)in_stack_ffffffffffffffd0->errcxlgc & 1) != 0)) ||
      (*(int *)((long)&in_stack_ffffffffffffffd0->errcxlog + 4) != in_ESI)) ||
     ((*(ushort *)&in_stack_ffffffffffffffd0->errcxlog < in_CX || (in_R9D != 0)))) {
    uVar5 = 0;
    local_2 = 0xffff;
    uVar6 = 0;
    desc_00 = *(mcsdsdef **)(in_RDI + 0x28);
    while( true ) {
      uVar4 = false;
      if ((uVar5 < *(ushort *)(in_RDI + 0x30)) && (uVar4 = false, uVar6 < 0x100)) {
        uVar4 = desc_00->mcsdsptr != 0;
      }
      if ((bool)uVar4 == false) break;
      in_stack_ffffffffffffffc0 = 0;
      for (in_stack_ffffffffffffffd0 = (errcxdef *)desc_00->mcsdsptr;
          (bVar1 = uVar5 < *(ushort *)(in_RDI + 0x30),
          in_stack_ffffffffffffffb8 = bVar1 && in_stack_ffffffffffffffc0 < 0x100,
          bVar1 && in_stack_ffffffffffffffc0 < 0x100 &&
          ((((((ulong)in_stack_ffffffffffffffd0->errcxlgc & 1) != 0 ||
             (*(ushort *)&in_stack_ffffffffffffffd0->errcxlog < in_CX)) ||
            ((local_2 != 0xffff &&
             (in_stack_ffffffffffffffba <= *(ushort *)&in_stack_ffffffffffffffd0->errcxlog)))) ||
           (in_stack_ffffffffffffffba = *(ushort *)&in_stack_ffffffffffffffd0->errcxlog,
           local_2 = uVar5, in_stack_ffffffffffffffba != in_CX))));
          in_stack_ffffffffffffffd0 = (errcxdef *)&in_stack_ffffffffffffffd0->errcxofs) {
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1;
        uVar5 = uVar5 + 1;
      }
      if ((local_2 != 0xffff) && (in_stack_ffffffffffffffba == in_CX)) break;
      desc_00 = (mcsdsdef *)&desc_00->mcsdssiz;
      uVar6 = uVar6 + 1;
    }
    if (local_2 == 0xffff) {
      if ((*(ulong *)(in_RDI + 0x20) < (ulong)in_CX) &&
         (mcscompact(in_stack_000001f0), *(ulong *)(in_RDI + 0x20) < (ulong)in_CX)) {
        errsigf((errcxdef *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),
                (char *)CONCAT26(local_2,CONCAT24(uVar5,CONCAT22(in_stack_ffffffffffffffba,
                                                                 CONCAT11(uVar4,
                                                  in_stack_ffffffffffffffb8)))),0);
      }
      local_2 = *(ushort *)(in_RDI + 0x30);
      if (0xff < (uint)((int)(uint)local_2 >> 8)) {
        errsigf((errcxdef *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),
                (char *)CONCAT26(local_2,CONCAT24(uVar5,CONCAT22(in_stack_ffffffffffffffba,
                                                                 CONCAT11(uVar4,
                                                  in_stack_ffffffffffffffb8)))),0);
      }
      if (*(long *)(*(long *)(in_RDI + 0x28) + (long)((int)(uint)local_2 >> 8) * 8) == 0) {
        puVar2 = mchalo(in_stack_ffffffffffffffd0,(size_t)desc_00,
                        (char *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
        *(uchar **)(*(long *)(in_RDI + 0x28) + (long)((int)(uint)local_2 >> 8) * 8) = puVar2;
      }
      pmVar3 = (mcscxdef *)
               (*(long *)(*(long *)(in_RDI + 0x28) + (long)((int)(uint)local_2 >> 8) * 8) +
               (long)(int)(local_2 & 0xff) * 0x18);
      pmVar3->mcscxfp = *(osfildef **)(in_RDI + 0x18);
      *(ushort *)&pmVar3->mcscxfname = in_CX;
      *(int *)((long)&pmVar3->mcscxfname + 4) = in_ESI;
      mcswrt(pmVar3,desc_00,(uchar *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),local_2);
      *(undefined2 *)&pmVar3->mcscxerr = 1;
      *(ulong *)(in_RDI + 0x18) = (ulong)in_CX + *(long *)(in_RDI + 0x18);
      *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - (ulong)in_CX;
      *(short *)(in_RDI + 0x30) = *(short *)(in_RDI + 0x30) + 1;
    }
    else {
      pmVar3 = (mcscxdef *)
               (*(long *)(*(long *)(in_RDI + 0x28) + (long)((int)(uint)local_2 >> 8) * 8) +
               (long)(int)(local_2 & 0xff) * 0x18);
      *(int *)((long)&pmVar3->mcscxfname + 4) = in_ESI;
      mcswrt(pmVar3,desc_00,(uchar *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),local_2);
      *(ushort *)&pmVar3->mcscxerr = *(ushort *)&pmVar3->mcscxerr | 1;
    }
  }
  else {
    *(ushort *)&in_stack_ffffffffffffffd0->errcxlgc =
         *(ushort *)&in_stack_ffffffffffffffd0->errcxlgc | 1;
    local_2 = in_R8W;
  }
  return local_2;
}

Assistant:

mcsseg mcsout(mcscxdef *ctx, uint objid, uchar *ptr, ushort siz,
              mcsseg oldseg, int dirty)
{
    mcsdsdef  *desc;
    mcsdsdef **pagep;
    uint       i;
    uint       j;
    mcsseg     min;
    mcsseg     cur;
    ushort     minsiz;
    
    IF_DEBUG(printf("<< mcsout: objid=%d, ptr=%lx, siz=%u, oldseg=%u >>\n",
                    objid, (unsigned long)ptr, siz, oldseg));
    
    /* see if old segment can be reused */
    if (oldseg != MCSSEGINV)
    {
        desc = mcsdsc(ctx, oldseg);
        if (!(desc->mcsdsflg & MCSDSFINUSE)     /* if old seg is not in use */
            && desc->mcsdsobj == objid            /* and it has same object */
            && desc->mcsdssiz >= siz           /* and it's still big enough */
            && !dirty)      /* and the object in memory hasn't been changed */
        {
            /* we can reuse the old segment without rewriting it */
            desc->mcsdsflg |= MCSDSFINUSE;        /* mark segment as in use */
            return(oldseg);
        }
    }
    
    /* look for the smallest unused segment big enough for this object */
    for (cur = 0, min = MCSSEGINV, i = 0, pagep = ctx->mcscxtab
         ; cur < ctx->mcscxmsg && i < MCSPAGETAB && *pagep ; ++pagep, ++i)
    {
        for (j = 0, desc = *pagep ; cur < ctx->mcscxmsg && j < MCSPAGECNT
             ; ++desc, ++j, ++cur)
        {
            if (!(desc->mcsdsflg & MCSDSFINUSE)
                && desc->mcsdssiz >= siz
                && (min == MCSSEGINV || desc->mcsdssiz < minsiz))
            {
                min = cur;
                minsiz = desc->mcsdssiz;
                if (minsiz == siz) break;       /* exact match - we're done */
            }
        }
        /* quit if we found an exact match */
        if (min != MCSSEGINV && minsiz == siz) break;
    }
    
    /* if we found nothing, allocate a new segment if possible */
    if (min == MCSSEGINV)
    {
        if (siz > ctx->mcscxmax)
        {
            /* swap file is too big; compact it and try again */
            mcscompact(ctx);
            if (siz > ctx->mcscxmax)
                errsig(ctx->mcscxerr, ERR_SWAPBIG);
        }
            
        min = ctx->mcscxmsg;
        if ((min >> 8) >= MCSPAGETAB)      /* exceeded pages in page table? */
            errsig(ctx->mcscxerr, ERR_SWAPPG);
        
        if (!ctx->mcscxtab[min >> 8])         /* haven't allocate page yet? */
        {
            ctx->mcscxtab[min >> 8] = 
                (mcsdsdef *)mchalo(ctx->mcscxerr,
                                   (MCSPAGECNT * sizeof(mcsdsdef)),
                                   "mcsout");
        }

        /* set up new descriptor */
        desc = mcsdsc(ctx, min);
        desc->mcsdsptr = ctx->mcscxtop;
        desc->mcsdssiz = siz;
        desc->mcsdsobj = objid;

        /* write out the segment */
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg = MCSDSFINUSE;

        /* update context information to account for new segment */
        ctx->mcscxtop += siz;             /* add to top seek offset in file */
        ctx->mcscxmax -= siz;                     /* take size out of quota */
        ctx->mcscxmsg++;                /* increment last segment allocated */
        
        return(min);
    }
    else
    {
        desc = mcsdsc(ctx, min);
        desc->mcsdsobj = objid;
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg |= MCSDSFINUSE;

        return(min);
    }
}